

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O1

void * __thiscall Span::malloc(Span *this,size_t __size)

{
  int iVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = (this->bitmap).size;
  uVar5 = 0;
  bVar3 = iVar1 < -1;
  if (-2 < iVar1) {
    pbVar2 = (byte *)(this->bitmap).bitmap;
    if ((*pbVar2 & 1) == 0) {
      uVar6 = 0;
      uVar5 = 0;
    }
    else {
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        uVar6 = uVar5 >> 3;
        bVar3 = iVar1 + 1 < (int)uVar6;
        if (iVar1 + 1 < (int)uVar6) goto LAB_00104015;
        uVar4 = uVar5 + 1;
      } while ((pbVar2[uVar6] >> (uVar5 & 7) & 1) != 0);
    }
    if (!bVar3) {
      pbVar2 = (byte *)((this->bitmap).bitmap + uVar6);
      *pbVar2 = *pbVar2 | (byte)(1 << ((byte)uVar5 & 7));
    }
  }
LAB_00104015:
  this->allocCount = this->allocCount + 1;
  return (void *)((long)(int)uVar5 * (long)this->elemsize + (long)this->startAddr);
}

Assistant:

void *Span::malloc() {
  for (int i = 0; i < nelems; i++) {
    if (bitmap.Get(i) == 0) {
      bitmap.Set(i);
      allocCount++;
      // 注意这个地址的计算要测试一下
      return (void *)((char *)startAddr + elemsize * i);
    }
  }
}